

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

void __thiscall CVmRun::makelstpar(CVmRun *this)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  int iVar2;
  int iVar3;
  vm_val_t *pvVar4;
  vm_val_t *pvVar5;
  int idx;
  vm_val_t val;
  vm_val_t val2;
  vm_val_t local_38;
  vm_val_t local_28;
  
  local_38.typ = sp_[-1].typ;
  local_38._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  local_38.val = sp_[-1].val;
  sp_ = sp_ + -1;
  pop_int(this,&local_28);
  iVar2 = vm_val_t::is_listlike(&local_38);
  if ((iVar2 == 0) || (iVar2 = vm_val_t::ll_length(&local_38), iVar2 < 0)) {
    pvVar4 = sp_ + 1;
    sp_->typ = local_38.typ;
    *(undefined4 *)&sp_->field_0x4 = local_38._4_4_;
    sp_->val = local_38.val;
    local_28.val.obj = local_28.val.obj + 1;
    pvVar5 = sp_ + 2;
  }
  else {
    iVar3 = CVmStack::check_space
                      (&this->super_CVmStack,
                       (((uint)*(ushort *)(entry_ptr_native_ + 4) + iVar2) -
                       (int)((ulong)((long)sp_ - (long)frame_ptr_) >> 4)) + 1);
    idx = iVar2;
    if (iVar3 == 0) {
      err_throw(0x8ff);
    }
    while (pvVar4 = sp_, idx != 0) {
      sp_ = sp_ + 1;
      vm_val_t::ll_index(&local_38,pvVar4,idx);
      idx = idx + -1;
    }
    local_28.val.obj = local_28.val.obj + iVar2;
    pvVar5 = sp_ + 1;
  }
  aVar1._4_4_ = local_28.val._4_4_;
  aVar1.obj = local_28.val.obj;
  sp_ = pvVar5;
  pvVar4->typ = local_28.typ;
  *(undefined4 *)&pvVar4->field_0x4 = local_28._4_4_;
  pvVar4->val = aVar1;
  return;
}

Assistant:

void CVmRun::makelstpar(VMG0_)
{
    /* pop the value and the argument counter so far */
    vm_val_t val, val2;
    popval(vmg_ &val);
    pop_int(vmg_ &val2);
    
    /* if it's not a list, just push it again unchanged */
    int lstcnt;
    if (!val.is_listlike(vmg0_)
        || (lstcnt = val.ll_length(vmg0_)) < 0)
    {
        /* put it back on the stack */
        pushval(vmg_ &val);
        
        /* increment the argument count and push it */
        ++val2.val.intval;
        pushval(vmg_ &val2);
        
        /* our work here is done */
        return;
    }

    /* set up a pointer to the current function header */
    CVmFuncPtr hdr_ptr;
    hdr_ptr.set(entry_ptr_native_);

    /* get the depth required for the header */
    uint hdr_depth = hdr_ptr.get_stack_depth();
    
    /* 
     *   deduct the amount stack space we've already used from the amount
     *   noted in the header, because that's the amount more that we could
     *   need for the fixed stuff
     */
    hdr_depth -= (get_depth_rel(frame_ptr_) - 1);
    
    /* make sure we have enough stack space available */
    if (!check_space(lstcnt + hdr_depth))
        err_throw(VMERR_STACK_OVERFLOW);
    
    /* push the elements of the list from last to first */
    for (uint i = lstcnt ; i != 0 ; --i)
    {
        /* push this element's value */
        val.ll_index(vmg_ push(), i);
    }

    /* increment and push the argument count */
    val2.val.intval += lstcnt;
    pushval(vmg_ &val2);
}